

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_FMPrepare(ym3438_t *chip)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Bit32u prevslot;
  ushort uStack_1e;
  Bit8u connect;
  Bit32u op;
  Bit16s mod2;
  Bit16s mod1;
  Bit16s mod;
  Bit32u channel;
  Bit32u slot;
  ym3438_t *chip_local;
  
  uVar4 = (chip->cycles + 6) % 0x18;
  uVar2 = chip->channel;
  uVar3 = uVar4 / 6;
  bVar1 = chip->connect[uVar2];
  uVar5 = (chip->cycles + 0x12) % 0x18;
  uStack_1e = 0;
  op._0_2_ = 0;
  if (fm_algorithm[uVar3][0][bVar1] != 0) {
    uStack_1e = chip->fm_op1[uVar2][0];
  }
  if (*(int *)((ulong)uVar3 * 0xc0 + 0x1c7010 + (ulong)bVar1 * 4) != 0) {
    op._0_2_ = chip->fm_op1[uVar2][1];
  }
  if (*(int *)((ulong)uVar3 * 0xc0 + 0x1c7030 + (ulong)bVar1 * 4) != 0) {
    op._0_2_ = (ushort)op | chip->fm_op2[uVar2];
  }
  if (*(int *)((ulong)uVar3 * 0xc0 + 0x1c7050 + (ulong)bVar1 * 4) != 0) {
    uStack_1e = uStack_1e | chip->fm_out[uVar5];
  }
  if (*(int *)((ulong)uVar3 * 0xc0 + 0x1c7070 + (ulong)bVar1 * 4) != 0) {
    op._0_2_ = (ushort)op | chip->fm_out[uVar5];
  }
  if (uVar3 == 0) {
    op._2_2_ = (Bit16u)((int)(short)((ushort)op + uStack_1e) >> (10 - chip->fb[uVar2] & 0x1f));
    if (chip->fb[uVar2] == '\0') {
      op._2_2_ = 0;
    }
  }
  else {
    op._2_2_ = (short)((ushort)op + uStack_1e) >> 1;
  }
  chip->fm_mod[uVar4] = op._2_2_;
  uVar3 = (chip->cycles + 0x12) % 0x18;
  if (uVar3 / 6 == 0) {
    chip->fm_op1[uVar2][1] = chip->fm_op1[uVar2][0];
    chip->fm_op1[uVar2][0] = chip->fm_out[uVar3];
  }
  if (uVar3 / 6 == 2) {
    chip->fm_op2[uVar2] = chip->fm_out[uVar3];
  }
  return;
}

Assistant:

static void NOPN2_FMPrepare(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 6) % 24;
    Bit32u channel = chip->channel;
    Bit16s mod, mod1, mod2;
    Bit32u op = slot / 6;
    Bit8u connect = chip->connect[channel];
    Bit32u prevslot = (chip->cycles + 18) % 24;

    /* Calculate modulation */
    mod1 = mod2 = 0;

    if (fm_algorithm[op][0][connect])
    {
        mod2 |= chip->fm_op1[channel][0];
    }
    if (fm_algorithm[op][1][connect])
    {
        mod1 |= chip->fm_op1[channel][1];
    }
    if (fm_algorithm[op][2][connect])
    {
        mod1 |= chip->fm_op2[channel];
    }
    if (fm_algorithm[op][3][connect])
    {
        mod2 |= chip->fm_out[prevslot];
    }
    if (fm_algorithm[op][4][connect])
    {
        mod1 |= chip->fm_out[prevslot];
    }
    mod = mod1 + mod2;
    if (op == 0)
    {
        /* Feedback */
        mod = mod >> (10 - chip->fb[channel]);
        if (!chip->fb[channel])
        {
            mod = 0;
        }
    }
    else
    {
        mod >>= 1;
    }
    chip->fm_mod[slot] = mod;

    slot = (chip->cycles + 18) % 24;
    /* OP1 */
    if (slot / 6 == 0)
    {
        chip->fm_op1[channel][1] = chip->fm_op1[channel][0];
        chip->fm_op1[channel][0] = chip->fm_out[slot];
    }
    /* OP2 */
    if (slot / 6 == 2)
    {
        chip->fm_op2[channel] = chip->fm_out[slot];
    }
}